

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JammingTechnique.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::JammingTechnique::Encode(JammingTechnique *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8Kind);
  KDataStream::Write(stream,this->m_ui8Category);
  KDataStream::Write(stream,this->m_ui8Subcategory);
  KDataStream::Write(stream,this->m_ui8Specific);
  return;
}

Assistant:

void JammingTechnique::Encode( KDataStream & stream ) const
{
    stream << m_ui8Kind
           << m_ui8Category
           << m_ui8Subcategory
           << m_ui8Specific;
}